

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::ScalarReplacementPass::GetOrCreatePointerType
          (ScalarReplacementPass *this,uint32_t id)

{
  bool bVar1;
  pointer ppVar2;
  IRContext *this_00;
  TypeManager *this_01;
  mapped_type *pmVar3;
  uint32_t ptr_type_id;
  TypeManager *type_mgr;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_28;
  iterator iter;
  uint32_t id_local;
  ScalarReplacementPass *this_local;
  
  iter.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur._4_4_ =
       id;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
       ::find(&this->pointee_to_pointer_,
              (key_type *)
              ((long)&iter.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                      _M_cur + 4));
  type_mgr = (TypeManager *)
             std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::end(&this->pointee_to_pointer_);
  bVar1 = std::__detail::operator!=
                    (&local_28,
                     (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> *)
                     &type_mgr);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::operator->
                       ((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false> *
                        )&local_28);
    this_local._4_4_ = ppVar2->second;
  }
  else {
    this_00 = Pass::context((Pass *)this);
    this_01 = IRContext::get_type_mgr(this_00);
    this_local._4_4_ =
         analysis::TypeManager::FindPointerToType
                   (this_01,iter.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                            ._M_cur._4_4_,Function);
    pmVar3 = std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](&this->pointee_to_pointer_,
                          (key_type *)
                          ((long)&iter.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                  ._M_cur + 4));
    *pmVar3 = this_local._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t ScalarReplacementPass::GetOrCreatePointerType(uint32_t id) {
  auto iter = pointee_to_pointer_.find(id);
  if (iter != pointee_to_pointer_.end()) return iter->second;

  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  uint32_t ptr_type_id =
      type_mgr->FindPointerToType(id, spv::StorageClass::Function);
  pointee_to_pointer_[id] = ptr_type_id;
  return ptr_type_id;
}